

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_ExcludesMixedFlags_Test::~TApp_ExcludesMixedFlags_Test(TApp_ExcludesMixedFlags_Test *this)

{
  TApp_ExcludesMixedFlags_Test *this_local;
  
  ~TApp_ExcludesMixedFlags_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, ExcludesMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--no")->excludes(opt1, "--opt2", opt3);

    run();

    app.reset();
    args = {"--no"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--no", "--opt1"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--no", "--opt2"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}